

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O0

bool __thiscall wasm::StackIROptimizer::isControlFlowEnd(StackIROptimizer *this,StackInst *inst)

{
  Op OVar1;
  StackInst *inst_local;
  StackIROptimizer *this_local;
  
  OVar1 = inst->op;
  if ((((OVar1 == BlockEnd) || (OVar1 == IfEnd)) || (OVar1 == LoopEnd)) ||
     (OVar1 == Delegate || OVar1 == TryEnd)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool isControlFlowEnd(StackInst* inst) {
    switch (inst->op) {
      case StackInst::BlockEnd:
      case StackInst::IfEnd:
      case StackInst::LoopEnd:
      case StackInst::TryEnd:
      case StackInst::Delegate: {
        return true;
      }
      default: { return false; }
    }
  }